

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::ConvolutionLayer2D<3UL>::outputInplace
          (ConvolutionLayer2D<3UL> *this,Array *inputImages)

{
  element_type *peVar1;
  element_type *peVar2;
  float *kernel;
  float *image;
  float *result;
  
  image = (float *)inputImages->_M_size;
  if (image != (float *)this->inputSize) {
    __assert_fail("inputImages.size() == inputSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x6a3,
                  "void notch::ConvolutionLayer2D<>::outputInplace(const Array &) [kernelSize = 3]")
    ;
  }
  peVar1 = (this->super_ABackpropLayer).shared.outputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    peVar2 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (image != (float *)0x0) {
      image = inputImages->_M_data;
    }
    kernel = (float *)peVar2->_M_size;
    if (kernel != (float *)0x0) {
      kernel = peVar2->_M_data;
    }
    result = (float *)peVar1->_M_size;
    if (result != (float *)0x0) {
      result = peVar1->_M_data;
    }
    internal::conv2d<3ul,float_const*,float*>
              (image,this->inputWidth,this->inputHeight,kernel,result);
    return;
  }
  __assert_fail("shared.outputBuffer != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x6a4,
                "void notch::ConvolutionLayer2D<>::outputInplace(const Array &) [kernelSize = 3]");
}

Assistant:

void outputInplace(const Array &inputImages) {
        assert(inputImages.size() == inputSize); // TODO: implement multiplane input
        assert(shared.outputBuffer != nullptr);
        const Array &kernel = *weights;
        Array &out = *shared.outputBuffer;
        internal::conv2d<kernelSize>
                         (std::begin(inputImages),
                          inputWidth, inputHeight,
                          std::begin(kernel), std::begin(out));
    }